

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::round_fp_tex_coords
          (string *__return_storage_ptr__,CompilerMSL *this,string *tex_coords,bool coord_is_fp)

{
  undefined3 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (CONCAT31(in_register_00000009,coord_is_fp) == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)tex_coords);
  }
  else {
    ::std::operator+(&local_30,"round(",tex_coords);
    ::std::operator+(__return_storage_ptr__,&local_30,")");
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::round_fp_tex_coords(string tex_coords, bool coord_is_fp)
{
	return coord_is_fp ? ("round(" + tex_coords + ")") : tex_coords;
}